

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void rec_comp_fixup(jit_State *J,BCIns *pc,int cond)

{
  uint uVar1;
  int iVar2;
  ushort *puVar3;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  SnapShot *snap;
  BCIns *npc;
  BCIns jmpins;
  jit_State *in_stack_000000f0;
  
  uVar1 = *(uint *)(in_RSI + 4);
  if (in_EDX == 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = (uVar1 >> 0x10) - 0x8000;
  }
  puVar3 = (ushort *)(*(long *)(in_RDI + 0x20) + (long)(int)(*(ushort *)(in_RDI + 0x1c) - 1) * 8);
  *(int *)(*(long *)(in_RDI + 0x28) + (long)(int)((uint)*puVar3 + (uint)(byte)puVar3[3]) * 4) =
       (int)in_RSI + 8 + iVar2 * 4;
  *(undefined1 *)(in_RDI + 0x95) = 1;
  if ((uVar1 >> 8 & 0xff) < *(uint *)(in_RDI + 0x8c)) {
    *(uint *)(in_RDI + 0x8c) = uVar1 >> 8 & 0xff;
  }
  lj_snap_shrink(in_stack_000000f0);
  return;
}

Assistant:

static void rec_comp_fixup(jit_State *J, const BCIns *pc, int cond)
{
  BCIns jmpins = pc[1];
  const BCIns *npc = pc + 2 + (cond ? bc_j(jmpins) : 0);
  SnapShot *snap = &J->cur.snap[J->cur.nsnap-1];
  /* Set PC to opposite target to avoid re-recording the comp. in side trace. */
  J->cur.snapmap[snap->mapofs + snap->nent] = SNAP_MKPC(npc);
  J->needsnap = 1;
  if (bc_a(jmpins) < J->maxslot) J->maxslot = bc_a(jmpins);
  lj_snap_shrink(J);  /* Shrink last snapshot if possible. */
}